

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string *filename,int line,int column,string *message,string *type,
          ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_50 [8];
  string dfile;
  string *type_local;
  string *message_local;
  int column_local;
  int line_local;
  string *filename_local;
  ErrorPrinter *this_local;
  
  dfile.field_2._8_8_ = type;
  std::__cxx11::string::string((string *)local_50);
  if (((this->format_ == ERROR_FORMAT_MSVS) && (this->tree_ != (DiskSourceTree *)0x0)) &&
     (bVar1 = DiskSourceTree::VirtualFileToDiskFile(this->tree_,filename,(string *)local_50), bVar1)
     ) {
    std::operator<<(out,(string *)local_50);
  }
  else {
    std::operator<<(out,(string *)filename);
  }
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_GCC) {
      poVar2 = std::operator<<(out,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,line + 1);
      poVar2 = std::operator<<(poVar2,":");
      std::ostream::operator<<(poVar2,column + 1);
    }
    else if (this->format_ == ERROR_FORMAT_MSVS) {
      poVar2 = std::operator<<(out,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,line + 1);
      poVar2 = std::operator<<(poVar2,") : ");
      poVar2 = std::operator<<(poVar2,(string *)dfile.field_2._8_8_);
      poVar2 = std::operator<<(poVar2," in column=");
      std::ostream::operator<<(poVar2,column + 1);
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          dfile.field_2._8_8_,"warning");
  if (bVar1) {
    poVar2 = std::operator<<(out,": warning: ");
    poVar2 = std::operator<<(poVar2,(string *)message);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<(out,": ");
    poVar2 = std::operator<<(poVar2,(string *)message);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void AddErrorOrWarning(const string& filename, int line, int column,
                         const string& message, const string& type,
                         std::ostream& out) {
    // Print full path when running under MSVS
    string dfile;
    if (format_ == CommandLineInterface::ERROR_FORMAT_MSVS &&
        tree_ != NULL &&
        tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : "
              << type << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }